

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfileinfo.cpp
# Opt level: O3

bool __thiscall QFileInfo::makeAbsolute(QFileInfo *this)

{
  QFileInfoPrivate *pQVar1;
  bool bVar2;
  long in_FS_OFFSET;
  QString local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->d_ptr).d.ptr;
  if ((pQVar1->field_0x1db & 0x40) == 0) {
    bVar2 = QFileSystemEntry::isRelative(&pQVar1->fileEntry);
    if (bVar2) {
      absoluteFilePath(&local_30,this);
      setFile(this,&local_30);
      if (&(local_30.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_30.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_30.d.d)->super_QArrayData,2,0x10);
        }
      }
      bVar2 = true;
      goto LAB_002394b3;
    }
  }
  bVar2 = false;
LAB_002394b3:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QFileInfo::makeAbsolute()
{
    if (d_ptr.constData()->isDefaultConstructed
            || !d_ptr.constData()->fileEntry.isRelative())
        return false;

    setFile(absoluteFilePath());
    return true;
}